

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O2

string * __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::mutable_stringvalue_abi_cxx11_
          (CustomModel_CustomModelParamValue *this)

{
  string *psVar1;
  
  if (this->_oneof_case_[0] != 0x14) {
    clear_value(this);
    this->_oneof_case_[0] = 0x14;
    this->value_ = (ValueUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  psVar1 = google::protobuf::internal::ArenaStringPtr::MutableNoArena
                     (&(this->value_).stringvalue_,
                      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  return psVar1;
}

Assistant:

inline ::std::string* CustomModel_CustomModelParamValue::mutable_stringvalue() {
  if (!has_stringvalue()) {
    clear_value();
    set_has_stringvalue();
    value_.stringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CustomModel.CustomModelParamValue.stringValue)
  return value_.stringvalue_.MutableNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}